

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O0

void fill_room(level *lev,mkroom *croom,boolean prefilled)

{
  schar sVar1;
  int iVar2;
  int local_24;
  int local_20;
  int y;
  int x;
  boolean prefilled_local;
  mkroom *croom_local;
  level *lev_local;
  
  if (croom == (mkroom *)0x0) {
    return;
  }
  if (croom->rtype == '\0') {
    return;
  }
  if (prefilled != '\0') goto LAB_002e0fdb;
  if ('\x11' < croom->rtype) {
    stock_room(croom->rtype + -0x12,lev,croom);
    *(uint *)&(lev->flags).field_0x8 = *(uint *)&(lev->flags).field_0x8 & 0xfffffffe | 1;
    return;
  }
  iVar2 = (int)croom->rtype;
  if (iVar2 != 2) {
    if (iVar2 == 4) {
      for (local_20 = (int)croom->lx; local_20 <= croom->hx; local_20 = local_20 + 1) {
        for (local_24 = (int)croom->ly; local_24 <= croom->hy; local_24 = local_24 + 1) {
          sVar1 = depth(&lev->z);
          iVar2 = (int)sVar1;
          if (iVar2 < 1) {
            iVar2 = -iVar2;
          }
          iVar2 = rn2(iVar2 * 100);
          mkgold((long)(iVar2 + 0x33),lev,local_20,local_24);
        }
      }
      goto LAB_002e0fdb;
    }
    if (((3 < iVar2 - 5U) && (iVar2 != 0xe)) && (iVar2 != 0x10)) goto LAB_002e0fdb;
  }
  fill_zoo(lev,croom);
LAB_002e0fdb:
  switch(croom->rtype) {
  case '\x02':
    *(uint *)&(lev->flags).field_0x8 = *(uint *)&(lev->flags).field_0x8 & 0xfffffff7 | 8;
    break;
  case '\x03':
    *(uint *)&(lev->flags).field_0x8 = *(uint *)&(lev->flags).field_0x8 & 0xfffffbff | 0x400;
    break;
  case '\x04':
    *(uint *)&(lev->flags).field_0x8 = *(uint *)&(lev->flags).field_0x8 & 0xfffffffd | 2;
    break;
  case '\x05':
    *(uint *)&(lev->flags).field_0x8 = *(uint *)&(lev->flags).field_0x8 & 0xffffffbf | 0x40;
    break;
  case '\x06':
    *(uint *)&(lev->flags).field_0x8 = *(uint *)&(lev->flags).field_0x8 & 0xffffffef | 0x10;
    break;
  case '\a':
    *(uint *)&(lev->flags).field_0x8 = *(uint *)&(lev->flags).field_0x8 & 0xffffff7f | 0x80;
    break;
  case '\b':
    *(uint *)&(lev->flags).field_0x8 = *(uint *)&(lev->flags).field_0x8 & 0xfffffffb | 4;
    break;
  case '\n':
    *(uint *)&(lev->flags).field_0x8 = *(uint *)&(lev->flags).field_0x8 & 0xfffffeff | 0x100;
    break;
  case '\x0e':
    *(uint *)&(lev->flags).field_0x8 = *(uint *)&(lev->flags).field_0x8 & 0xffffffdf | 0x20;
    break;
  case '\x10':
    *(uint *)&(lev->flags).field_0x8 = *(uint *)&(lev->flags).field_0x8 & 0xfffffdff | 0x200;
  }
  return;
}

Assistant:

void fill_room(struct level *lev, struct mkroom *croom, boolean prefilled)
{
	if (!croom || croom->rtype == OROOM)
	    return;

	if (!prefilled) {
	    int x, y;

	    /* Shop ? */
	    if (croom->rtype >= SHOPBASE) {
		stock_room(croom->rtype - SHOPBASE, lev, croom);
		lev->flags.has_shop = TRUE;
		return;
	    }

	    switch (croom->rtype) {
		case VAULT:
		    for (x = croom->lx; x <= croom->hx; x++)
			for (y = croom->ly; y<=croom->hy; y++)
			    mkgold((long)rn1(abs(depth(&lev->z)) * 100, 51),
				   lev, x, y);
		    break;
		case GARDEN:
		case COURT:
		case ZOO:
		case BEEHIVE:
		case LEMUREPIT:
		case MORGUE:
		case BARRACKS:
		    fill_zoo(lev, croom);
		    break;
	    }
	}
	switch (croom->rtype) {
	    case VAULT:
		lev->flags.has_vault = TRUE;
		break;
	    case ZOO:
		lev->flags.has_zoo = TRUE;
		break;
	    case GARDEN:
		lev->flags.has_garden = TRUE;
		break;
	    case COURT:
		lev->flags.has_court = TRUE;
		break;
	    case MORGUE:
		lev->flags.has_morgue = TRUE;
		break;
	    case BEEHIVE:
		lev->flags.has_beehive = TRUE;
		break;
	    case LEMUREPIT:
		lev->flags.has_lemurepit = TRUE;
		break;
	    case BARRACKS:
		lev->flags.has_barracks = TRUE;
		break;
	    case TEMPLE:
		lev->flags.has_temple = TRUE;
		break;
	    case SWAMP:
		lev->flags.has_swamp = TRUE;
		break;
	}
}